

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
booster::locale::basic_format<wchar_t>::format_output
          (basic_format<wchar_t> *this,stream_type *out,string_type *sformat)

{
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *value_00;
  pointer pwVar1;
  bool bVar2;
  wchar_t wVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  formattible_type fVar7;
  undefined1 local_d8 [8];
  string key;
  string_type value;
  code *local_90;
  size_type *local_88;
  string svalue;
  format_parser local_60 [8];
  format_parser fmt;
  undefined1 local_50 [8];
  format_guard guard;
  
  pwVar1 = (sformat->_M_dataplus)._M_p;
  guard._8_8_ = sformat->_M_string_length;
  value_00 = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             (&key.field_2._M_allocated_capacity + 1);
  uVar6 = 0;
  svalue.field_2._8_8_ = this;
LAB_00162ab6:
  do {
    for (; wVar3 = pwVar1[uVar6], wVar3 == L'{'; uVar6 = uVar6 + 2) {
      uVar5 = uVar6 + 1;
      if (((ulong)guard._8_8_ <= uVar5) || (pwVar1[uVar6 + 1] != L'{')) {
        booster::locale::details::format_parser::format_parser
                  (local_60,(ios_base *)(out + *(long *)(*(long *)out + -0x18)),out,imbue_locale);
        guard.fmt_._0_1_ = 0;
        local_50 = (undefined1  [8])local_60;
LAB_00162b3a:
        if (uVar5 < (ulong)guard._8_8_) {
          local_d8 = (undefined1  [8])&key._M_string_length;
          key._M_dataplus._M_p = (pointer)0x0;
          key._M_string_length._0_1_ = 0;
          local_88 = &svalue._M_string_length;
          svalue._M_dataplus._M_p = (pointer)0x0;
          key.field_2._8_8_ = &value._M_string_length;
          value._M_dataplus._M_p = (pointer)0x0;
          svalue._M_string_length._0_1_ = 0;
          value._M_string_length._0_4_ = 0;
          for (; (wVar3 = pwVar1[uVar5], wVar3 != L'\0' && (wVar3 != L',')); uVar5 = uVar5 + 1) {
            if (wVar3 == L'=') {
              wVar3 = pwVar1[uVar5 + 1];
              uVar6 = uVar5;
              if (wVar3 != L'\'') goto LAB_00162c0f;
              uVar5 = uVar5 + 2;
              goto LAB_00162bd1;
            }
            if (wVar3 == L'}') break;
            std::__cxx11::string::push_back((char)(string *)local_d8);
          }
          goto LAB_00162c33;
        }
        goto LAB_00162cdb;
      }
      wVar3 = L'{';
LAB_00162b05:
      std::operator<<((wostream *)out,wVar3);
    }
    if (wVar3 == L'}') {
      if (pwVar1[uVar6 + 1] == L'}') {
        wVar3 = L'}';
        goto LAB_00162b05;
      }
    }
    else if (wVar3 == L'\0') {
      return;
    }
    std::operator<<((wostream *)out,wVar3);
    uVar6 = uVar6 + 1;
  } while( true );
LAB_00162c0f:
  while (((uVar5 = uVar6 + 1, wVar3 != L'\0' && (wVar3 != L',')) && (wVar3 != L'}'))) {
    std::__cxx11::string::push_back((char)&local_88);
    wVar3 = pwVar1[uVar6 + 2];
    uVar6 = uVar5;
  }
LAB_00162c33:
  booster::locale::details::format_parser::set_one_flag((string *)local_60,(string *)local_d8);
LAB_00162c43:
  if (pwVar1[uVar5] == L'}') {
    booster::locale::details::format_parser::get_position();
    fVar7 = get((basic_format<wchar_t> *)((long)&value.field_2 + 8),(uint)svalue.field_2._8_8_);
    (*local_90)(out,value.field_2._8_8_,fVar7.writer_);
    format_guard::restore((format_guard *)local_50);
    uVar5 = uVar5 + 1;
  }
  else {
    if (pwVar1[uVar5] == L',') {
      uVar5 = uVar5 + 1;
      bVar2 = true;
      goto LAB_00162ca0;
    }
    format_guard::restore((format_guard *)local_50);
  }
  bVar2 = false;
LAB_00162ca0:
  std::__cxx11::wstring::~wstring((wstring *)value_00);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)local_d8);
  if (!bVar2) goto LAB_00162cdb;
  goto LAB_00162b3a;
LAB_00162bd1:
  if (pwVar1[uVar5] != L'\'') {
    if (pwVar1[uVar5] == L'\0') goto LAB_00162cc7;
    std::__cxx11::wstring::push_back((wchar_t)value_00);
    lVar4 = 1;
LAB_00162c0a:
    uVar5 = uVar5 + lVar4;
    goto LAB_00162bd1;
  }
  if (pwVar1[uVar5 + 1] == L'\'') {
    std::__cxx11::wstring::push_back((wchar_t)value_00);
    lVar4 = 2;
    goto LAB_00162c0a;
  }
  uVar5 = uVar5 + 1;
LAB_00162cc7:
  details::format_parser::set_flag_with_str<wchar_t>(local_60,(string *)local_d8,value_00);
  goto LAB_00162c43;
LAB_00162cdb:
  format_guard::~format_guard((format_guard *)local_50);
  booster::locale::details::format_parser::~format_parser(local_60);
  uVar6 = uVar5;
  goto LAB_00162ab6;
}

Assistant:

void format_output(stream_type &out,string_type const &sformat) const
            {
                char_type obrk='{';
                char_type cbrk='}';
                char_type eq='=';
                char_type comma=',';
                char_type quote='\'';

                size_t pos = 0;
                size_t size=sformat.size();
                CharType const *format=sformat.c_str();
                while(format[pos]!=0) {
                    if(format[pos] != obrk) {
                        if(format[pos]==cbrk && format[pos+1]==cbrk) {
                            out << cbrk;
                            pos+=2;
                        }
                        else {
                            out<<format[pos];
                            pos++;
                        }
                        continue;
                    }

                    if(pos+1 < size && format[pos+1]==obrk) {
                        out << obrk;
                        pos+=2;
                        continue;
                    }
                    pos++;
                  
                    details::format_parser fmt(out,static_cast<void *>(&out),&basic_format::imbue_locale);

                    format_guard guard(fmt);

                    while(pos < size) { 
                        std::string key;
                        std::string svalue;
                        string_type value;
                        bool use_svalue = true;
                        for(;format[pos];pos++) {
                            char_type c=format[pos];
                            if(c==comma || c==eq || c==cbrk)
                                break;
                            else {
                                key+=static_cast<char>(c);
                            }
                        }

                        if(format[pos]==eq) {
                            pos++;
                            if(format[pos]==quote) {
                                pos++;
                                use_svalue = false;
                                while(format[pos]) {
                                    if(format[pos]==quote) {
                                        if(format[pos+1]==quote) {
                                            value+=quote;
                                            pos+=2;
                                        }
                                        else {
                                            pos++;
                                            break;
                                        }
                                    }
                                    else {
                                        value+=format[pos];
                                        pos++;
                                    }
                                }
                            }
                            else {
                                char_type c;
                                while((c=format[pos])!=0 && c!=comma && c!=cbrk) {
                                    svalue+=static_cast<char>(c);
                                    pos++;
                                }
                            }
                        }

                        if(use_svalue) {
                            fmt.set_one_flag(key,svalue);
                        }
                        else 
                            fmt.set_flag_with_str(key,value);
                        
                        if(format[pos]==comma) {
                            pos++;
                            continue;
                        }
                        else if(format[pos]==cbrk)  {
                            unsigned position = fmt.get_position();
                            out << get(position);
                            guard.restore();
                            pos++;
                            break;
                        }
                        else {                        
                            guard.restore();
                            break;
                        }
                    }
                }
            }